

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> * __thiscall
kj::anon_unknown_36::WebSocketImpl::ZlibContext::processMessage
          (OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> *__return_storage_ptr__,
          ZlibContext *this,ArrayPtr<const_unsigned_char> message,Maybe<unsigned_long> *maxSize,
          bool addNullTerminator)

{
  bool bVar1;
  Tag TVar2;
  uchar *puVar3;
  size_t sVar4;
  OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>
  *pOVar5;
  ProtocolError *pPVar6;
  Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *pVVar7;
  Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *pVVar8;
  Result *pRVar9;
  uchar *__src;
  Array<unsigned_char> *other;
  Fault local_1a0;
  Fault f;
  unsigned_long *local_190;
  undefined1 local_188 [8];
  DebugComparison<unsigned_long_&,_unsigned_long> _kjCondition;
  Result *part_1;
  Result *__end3_1;
  Result *__begin3_1;
  Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *__range3_1;
  size_t currentIndex;
  Array<unsigned_char> processedMessage;
  Result *part;
  Result *__end3;
  Result *__begin3;
  Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *__range3;
  size_t amountToAllocate;
  Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *_kj_switch_done_1;
  Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *dataParts;
  ProtocolError *_kj_switch_done;
  ProtocolError *protocolError;
  Maybe<unsigned_long> local_c0;
  OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>
  local_b0;
  undefined1 local_88 [8];
  NullableValue<kj::OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>_>
  _kj_switch_subject;
  Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> parts;
  bool addNullTerminator_local;
  Maybe<unsigned_long> *maxSize_local;
  ZlibContext *this_local;
  ArrayPtr<const_unsigned_char> message_local;
  
  message_local.ptr = (uchar *)message.size_;
  this_local = (ZlibContext *)message.ptr;
  message_local.size_ = (size_t)__return_storage_ptr__;
  puVar3 = ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&this_local);
  (this->ctx).next_in = puVar3;
  sVar4 = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&this_local);
  (this->ctx).avail_in = (uInt)sVar4;
  Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>::Vector
            ((Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *)
             ((long)&_kj_switch_subject.field_1.value.field_1 + 0x18));
  Maybe<unsigned_long>::Maybe(&local_c0,maxSize);
  processLoop(&local_b0,this,&local_c0);
  OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>
  ::_switchSubject((NullableValue<kj::OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>_>
                    *)local_88,&local_b0);
  OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>
  ::~OneOf(&local_b0);
  Maybe<unsigned_long>::~Maybe(&local_c0);
  pOVar5 = kj::_::
           NullableValue<kj::OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>_>
           ::operator->((NullableValue<kj::OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>_>
                         *)local_88);
  TVar2 = OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>
          ::which(pOVar5);
  if (TVar2 == _variant0) {
    pOVar5 = kj::_::
             NullableValue<kj::OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>_>
             ::operator->((NullableValue<kj::OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>_>
                           *)local_88);
    pVVar7 = OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,kj::WebSocket::ProtocolError>
             ::get<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>>
                       ((OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,kj::WebSocket::ProtocolError>
                         *)pOVar5);
    amountToAllocate = (size_t)pVVar7;
    while (amountToAllocate != 0) {
      pVVar8 = mv<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>>(pVVar7)
      ;
      Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>::operator=
                ((Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *)
                 ((long)&_kj_switch_subject.field_1.value.field_1 + 0x18),pVVar8);
      amountToAllocate = 0;
    }
  }
  else if (TVar2 == _variant1) {
    pOVar5 = kj::_::
             NullableValue<kj::OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>_>
             ::operator->((NullableValue<kj::OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>_>
                           *)local_88);
    pPVar6 = OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>
             ::get<kj::WebSocket::ProtocolError>(pOVar5);
    if (pPVar6 == (ProtocolError *)0x0) {
      dataParts._4_4_ = 2;
    }
    else {
      pPVar6 = mv<kj::WebSocket::ProtocolError>(pPVar6);
      OneOf<kj::Array<unsigned_char>,kj::WebSocket::ProtocolError>::
      OneOf<kj::WebSocket::ProtocolError,int>
                ((OneOf<kj::Array<unsigned_char>,kj::WebSocket::ProtocolError> *)
                 __return_storage_ptr__,pPVar6);
      dataParts._4_4_ = 1;
    }
    goto LAB_006470ff;
  }
  dataParts._4_4_ = 0;
LAB_006470ff:
  kj::_::
  NullableValue<kj::OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>_>
  ::~NullableValue((NullableValue<kj::OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>_>
                    *)local_88);
  if ((dataParts._4_4_ == 0) || (dataParts._4_4_ == 2)) {
    __range3 = (Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *)0x0;
    pVVar7 = (Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *)
             ((long)&_kj_switch_subject.field_1.value.field_1 + 0x18);
    __end3 = Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>::begin(pVVar7);
    pRVar9 = Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>::end(pVVar7);
    for (; __end3 != pRVar9; __end3 = __end3 + 1) {
      processedMessage.disposer = (ArrayDisposer *)__end3;
      __range3 = (Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *)
                 ((long)&(__range3->builder).ptr + __end3->size);
    }
    if (addNullTerminator) {
      __range3 = (Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *)
                 ((long)&(__range3->builder).ptr + 1);
    }
    heapArray<unsigned_char>((Array<unsigned_char> *)&currentIndex,(size_t)__range3);
    __range3_1 = (Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *)0x0;
    pVVar7 = (Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *)
             ((long)&_kj_switch_subject.field_1.value.field_1 + 0x18);
    __end3_1 = Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>::begin(pVVar7);
    pRVar9 = Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>::end(pVVar7);
    for (; pVVar7 = __range3_1, __end3_1 != pRVar9; __end3_1 = __end3_1 + 1) {
      _kjCondition._32_8_ = __end3_1;
      puVar3 = Array<unsigned_char>::operator[]
                         ((Array<unsigned_char> *)&currentIndex,(size_t)__range3_1);
      __src = Array<const_unsigned_char>::begin
                        ((Array<const_unsigned_char> *)(_kjCondition._32_8_ + 8));
      memcpy(puVar3,__src,*(size_t *)(_kjCondition._32_8_ + 0x20));
      __range3_1 = (Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *)
                   ((long)&(__range3_1->builder).ptr + *(long *)(_kjCondition._32_8_ + 0x20));
    }
    if (addNullTerminator) {
      __range3_1 = (Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *)
                   ((long)&(__range3_1->builder).ptr + 1);
      puVar3 = Array<unsigned_char>::operator[]
                         ((Array<unsigned_char> *)&currentIndex,(size_t)pVVar7);
      *puVar3 = '\0';
    }
    local_190 = (unsigned_long *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(unsigned_long *)&__range3_1
                          );
    f.exception = (Exception *)Array<unsigned_char>::size((Array<unsigned_char> *)&currentIndex);
    kj::_::DebugExpression<unsigned_long&>::operator==
              ((DebugComparison<unsigned_long_&,_unsigned_long> *)local_188,
               (DebugExpression<unsigned_long&> *)&local_190,(unsigned_long *)&f);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_188);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long>&>
                (&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0xd00,FAILED,"currentIndex == processedMessage.size()","_kjCondition,",
                 (DebugComparison<unsigned_long_&,_unsigned_long> *)local_188);
      kj::_::Debug::Fault::fatal(&local_1a0);
    }
    other = mv<kj::Array<unsigned_char>>((Array<unsigned_char> *)&currentIndex);
    OneOf<kj::Array<unsigned_char>,kj::WebSocket::ProtocolError>::
    OneOf<kj::Array<unsigned_char>,int>
              ((OneOf<kj::Array<unsigned_char>,kj::WebSocket::ProtocolError> *)
               __return_storage_ptr__,other);
    Array<unsigned_char>::~Array((Array<unsigned_char> *)&currentIndex);
  }
  Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>::~Vector
            ((Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *)
             ((long)&_kj_switch_subject.field_1.value.field_1 + 0x18));
  return __return_storage_ptr__;
}

Assistant:

kj::OneOf<kj::Array<kj::byte>, ProtocolError> processMessage(kj::ArrayPtr<const byte> message,
        kj::Maybe<size_t> maxSize = kj::none,
        bool addNullTerminator = false) {
      // If `this` is the compressor, calling `processMessage()` will compress the `message`.
      // Likewise, if `this` is the decompressor, `processMessage()` will decompress the `message`.
      //
      // `maxSize` is only passed in when decompressing, since we want to ensure the decompressed
      // message is smaller than the `maxSize` passed to `receive()`.
      //
      // If (de)compression is successful, the result is returned as a Vector, otherwise,
      // an Exception is thrown.

      ctx.next_in = const_cast<byte*>(reinterpret_cast<const byte*>(message.begin()));
      ctx.avail_in = message.size();

      kj::Vector<Result> parts;
      KJ_SWITCH_ONEOF(processLoop(maxSize)) {
        KJ_CASE_ONEOF(protocolError, ProtocolError) {
          return kj::mv(protocolError);
        }
        KJ_CASE_ONEOF(dataParts, kj::Vector<Result>) {
          parts = kj::mv(dataParts);
        }
      }

      size_t amountToAllocate = 0;
      for (const auto& part : parts) {
        amountToAllocate += part.size;
      }

      if (addNullTerminator) {
        // Add space for the null-terminator.
        amountToAllocate += 1;
      }

      kj::Array<kj::byte> processedMessage = kj::heapArray<kj::byte>(amountToAllocate);
      size_t currentIndex = 0; // Current index into processedMessage.
      for (const auto& part : parts) {
        memcpy(&processedMessage[currentIndex], part.buffer.begin(), part.size);
        // We need to use `part.size` to determine the number of useful bytes, since data after
        // `part.size` is unused (and probably junk).
        currentIndex += part.size;
      }

      if (addNullTerminator) {
        processedMessage[currentIndex++] = '\0';
      }

      KJ_ASSERT(currentIndex == processedMessage.size());

      return kj::mv(processedMessage);
    }